

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O0

int value_for_key_as_string(MMDB_entry_s *start,char *key,char **value)

{
  char *pcVar1;
  char *pcStack_68;
  int status;
  char *path [2];
  MMDB_entry_data_s entry_data;
  char **value_local;
  char *key_local;
  MMDB_entry_s *start_local;
  
  path[0] = (char *)0x0;
  pcStack_68 = key;
  start_local._4_4_ =
       MMDB_aget_value(start,(MMDB_entry_data_s *)(path + 1),&stack0xffffffffffffff98);
  if (start_local._4_4_ == 0) {
    if (entry_data.offset_to_next == 2) {
      pcVar1 = mmdb_strndup((char *)entry_data._8_8_,(ulong)entry_data.offset);
      *value = pcVar1;
      if (*value == (char *)0x0) {
        start_local._4_4_ = 5;
      }
      else {
        start_local._4_4_ = 0;
      }
    }
    else {
      start_local._4_4_ = 3;
    }
  }
  return start_local._4_4_;
}

Assistant:

static int
value_for_key_as_string(MMDB_entry_s *start, char *key, char const **value) {
    MMDB_entry_data_s entry_data;
    const char *path[] = {key, NULL};
    int status = MMDB_aget_value(start, &entry_data, path);
    if (MMDB_SUCCESS != status) {
        return status;
    }
    if (MMDB_DATA_TYPE_UTF8_STRING != entry_data.type) {
        DEBUG_MSGF("expect string for %s but received %s",
                   key,
                   type_num_to_name(entry_data.type));
        return MMDB_INVALID_METADATA_ERROR;
    }
    *value = mmdb_strndup(entry_data.utf8_string, entry_data.data_size);
    if (NULL == *value) {
        return MMDB_OUT_OF_MEMORY_ERROR;
    }
    return MMDB_SUCCESS;
}